

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1_int8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse
               (Mat *kernel,Mat *kernel_tm_pack8to1,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  long lVar21;
  undefined2 *puVar22;
  ulong uVar23;
  long lVar24;
  void *pvVar25;
  long lVar26;
  undefined2 *puVar27;
  uint *puVar28;
  ulong uVar29;
  long lVar30;
  undefined4 uVar31;
  undefined2 *puVar32;
  int k;
  undefined2 *puVar33;
  ulong uVar34;
  long lVar35;
  short tmp [6] [3];
  ulong local_e8;
  void *local_d0;
  undefined1 local_c8 [64];
  size_t local_88;
  void *local_78;
  long local_70;
  ulong local_68;
  undefined8 local_60;
  short sStack_58;
  uint auStack_56 [9];
  
  uVar34 = (ulong)(uint)outch;
  iVar18 = cpu_support_x86_avx2();
  if (iVar18 != 0) {
    conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2
              (kernel,kernel_tm_pack8to1,inch,outch,opt);
    return;
  }
  iVar18 = cpu_support_x86_xop();
  if (iVar18 == 0) {
    local_88 = 0;
    local_c8._0_8_ = (void *)0x0;
    local_c8._8_4_ = 0;
    local_c8._12_4_ = 0;
    local_c8._16_8_ = 0;
    local_c8._24_4_ = 0;
    local_c8._32_8_ = (Allocator *)0x0;
    local_c8._40_4_ = 0;
    local_c8._44_4_ = 0;
    local_c8._48_12_ = SUB1612((undefined1  [16])0x0,4);
    Mat::create((Mat *)local_c8,0x24,inch,outch,2,(Allocator *)0x0);
    if (0 < outch) {
      local_78 = kernel->data;
      local_d0 = (void *)local_c8._0_8_;
      local_70 = local_88 * local_c8._16_8_;
      local_60 = (long)(int)local_c8._44_4_ * local_c8._16_8_;
      local_e8 = 0;
      do {
        if (0 < inch) {
          iVar18 = inch * 9 * (int)local_e8;
          uVar20 = 0;
          pvVar25 = local_d0;
          do {
            lVar35 = uVar20 * 9;
            cVar1 = *(char *)((long)local_78 + lVar35 + iVar18);
            cVar2 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 1);
            cVar3 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 2);
            cVar4 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 3);
            cVar5 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 4);
            cVar6 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 5);
            cVar7 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 6);
            cVar8 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 7);
            cVar9 = *(char *)((long)local_78 + lVar35 + (long)iVar18 + 8);
            lVar35 = 4;
            do {
              sVar10 = *(short *)(&UNK_00559d8c + lVar35);
              sVar11 = *(short *)(&UNK_00559d8e + lVar35);
              sVar12 = *(short *)((long)&DAT_00559d90 + lVar35);
              *(short *)((long)&local_60 + lVar35 + 4) =
                   sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
              *(short *)((long)&local_60 + lVar35 + 6) =
                   sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
              *(short *)((long)auStack_56 + lVar35 + -2) =
                   sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
              lVar35 = lVar35 + 6;
            } while (lVar35 != 0x28);
            lVar35 = 0;
            pvVar19 = pvVar25;
            do {
              sVar10 = *(short *)((long)auStack_56 + lVar35 * 6 + -2);
              uVar13 = *(uint *)((long)auStack_56 + lVar35 * 6);
              puVar28 = &DAT_00559d92;
              lVar30 = 0;
              do {
                auVar16 = vpmullw_avx(ZEXT416(*puVar28),ZEXT416(uVar13));
                uVar31 = vpextrw_avx(auVar16,1);
                *(short *)((long)pvVar19 + lVar30 * 2) =
                     (short)uVar31 + auVar16._0_2_ + *(short *)((long)puVar28 + -2) * sVar10;
                lVar30 = lVar30 + 1;
                puVar28 = (uint *)((long)puVar28 + 6);
              } while (lVar30 != 6);
              lVar35 = lVar35 + 1;
              pvVar19 = (void *)((long)pvVar19 + 0xc);
            } while (lVar35 != 6);
            uVar20 = uVar20 + 1;
            pvVar25 = (void *)((long)pvVar25 + local_60);
          } while (uVar20 != (uint)inch);
        }
        local_e8 = local_e8 + 1;
        local_d0 = (void *)((long)local_d0 + local_70);
        local_68 = (ulong)(uint)inch;
      } while (local_e8 != uVar34);
    }
    iVar18 = outch + 3;
    if (-1 < outch) {
      iVar18 = outch;
    }
    Mat::create(kernel_tm_pack8to1,inch,0x24,outch + (iVar18 >> 2) * -3,8,4,(Allocator *)0x0);
    uVar20 = 0;
    if (3 < outch) {
      iVar18 = kernel_tm_pack8to1->w;
      pvVar25 = kernel_tm_pack8to1->data;
      sVar14 = kernel_tm_pack8to1->elemsize;
      sVar15 = kernel_tm_pack8to1->cstep;
      uVar29 = 0;
      do {
        puVar32 = (undefined2 *)(local_88 * local_c8._16_8_ * uVar29 + local_c8._0_8_);
        lVar35 = 0;
        do {
          if (7 < inch) {
            lVar30 = (long)pvVar25 +
                     (long)iVar18 * sVar14 * lVar35 + (uVar29 >> 2) * sVar15 * sVar14;
            puVar27 = puVar32;
            lVar26 = 0;
            do {
              lVar24 = 0;
              puVar33 = puVar27;
              do {
                lVar21 = lVar30;
                lVar30 = 0;
                puVar22 = puVar33;
                do {
                  *(undefined2 *)(lVar21 + lVar30) = *puVar22;
                  puVar22 = (undefined2 *)
                            ((long)puVar22 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
                  lVar30 = lVar30 + 2;
                } while (lVar30 != 0x10);
                lVar24 = lVar24 + 1;
                puVar33 = (undefined2 *)((long)puVar33 + local_88 * local_c8._16_8_);
                lVar30 = lVar21 + 0x10;
              } while (lVar24 != 4);
              lVar24 = lVar26 + 0xf;
              puVar27 = puVar27 + (long)(int)local_c8._44_4_ * local_c8._16_8_ * 4;
              lVar30 = lVar21 + 0x10;
              lVar26 = lVar26 + 8;
            } while (lVar24 < inch);
          }
          lVar35 = lVar35 + 1;
          puVar32 = puVar32 + 1;
        } while (lVar35 != 0x24);
        uVar20 = uVar29 + 4;
        uVar23 = uVar29 + 7;
        uVar29 = uVar20;
      } while (uVar23 < uVar34);
    }
    if ((int)uVar20 < outch) {
      iVar18 = kernel_tm_pack8to1->w;
      pvVar25 = kernel_tm_pack8to1->data;
      sVar14 = kernel_tm_pack8to1->elemsize;
      sVar15 = kernel_tm_pack8to1->cstep;
      uVar20 = uVar20 & 0xffffffff;
      puVar32 = (undefined2 *)(local_88 * local_c8._16_8_ * uVar20 + local_c8._0_8_);
      do {
        lVar35 = 0;
        puVar27 = puVar32;
        do {
          if (7 < inch) {
            lVar26 = (long)pvVar25 +
                     (long)iVar18 * sVar14 * lVar35 +
                     (ulong)(((uint)uVar20 & 3) + ((uint)(uVar20 >> 2) & 0x3fffffff)) *
                     sVar15 * sVar14;
            lVar30 = 0;
            puVar33 = puVar27;
            do {
              lVar24 = 0;
              puVar22 = puVar33;
              do {
                *(undefined2 *)(lVar26 + lVar24) = *puVar22;
                puVar22 = (undefined2 *)
                          ((long)puVar22 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
                lVar24 = lVar24 + 2;
              } while (lVar24 != 0x10);
              lVar24 = lVar30 + 0xf;
              puVar33 = puVar33 + (long)(int)local_c8._44_4_ * local_c8._16_8_ * 4;
              lVar26 = lVar26 + 0x10;
              lVar30 = lVar30 + 8;
            } while (lVar24 < inch);
          }
          lVar35 = lVar35 + 1;
          puVar27 = puVar27 + 1;
        } while (lVar35 != 0x24);
        uVar20 = uVar20 + 1;
        puVar32 = (undefined2 *)((long)puVar32 + local_88 * local_c8._16_8_);
      } while (uVar20 != uVar34);
    }
    piVar17 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
    if (piVar17 != (int *)0x0) {
      LOCK();
      *piVar17 = *piVar17 + -1;
      UNLOCK();
      if (*piVar17 == 0) {
        if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
          if ((void *)local_c8._0_8_ != (void *)0x0) {
            free((void *)local_c8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_c8._32_8_)[3])();
        }
      }
    }
    return;
  }
  conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop
            (kernel,kernel_tm_pack8to1,inch,outch,opt);
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(const Mat& kernel, Mat& kernel_tm_pack8to1, int inch, int outch, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx512vnni(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avxvnni(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop(kernel, kernel_tm_pack8to1, inch, outch, opt);
        return;
    }
#endif
#endif

    // winograd43 transform kernel
    Mat kernel_tm(6 * 6, inch, outch, (size_t)2u);

    const short ktm[6][3] = {
        {6, 0, 0},
        {-4, -4, -4},
        {-4, 4, -4},
        {1, 2, 4},
        {1, -2, 4},
        {0, 0, 6}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const signed char* kernel0 = (const signed char*)kernel + p * inch * 9 + q * 9;
            short* kernel_tm0 = kernel_tm.channel(p).row<short>(q);

            // transform kernel
            const signed char* k0 = kernel0;
            const signed char* k1 = kernel0 + 3;
            const signed char* k2 = kernel0 + 6;

            // h
            short tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                short* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = 4b-8a-inch/8a-36-outch/4b
    kernel_tm_pack8to1.create(8 * inch / 8, 36, outch / 4 + outch % 4, (size_t)2u * 4, 4);

    int p = 0;
    for (; p + 3 < outch; p += 4)
    {
        Mat g0 = kernel_tm_pack8to1.channel(p / 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = g0.row<short>(k);

            for (int q = 0; q + 7 < inch; q += 8)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const short* k00 = kernel_tm.channel(p + i).row<const short>(q + j);
                        g00[0] = k00[k];
                        g00 += 1;
                    }
                }
            }
        }
    }
    for (; p < outch; p++)
    {
        const Mat k0 = kernel_tm.channel(p);

        Mat g0 = kernel_tm_pack8to1.channel(p / 4 + p % 4);

        for (int k = 0; k < 36; k++)
        {
            short* g00 = g0.row<short>(k);

            for (int q = 0; q + 7 < inch; q += 8)
            {
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0.row<const short>(q + i)[k];

                    g00 += 1;
                }
            }
        }
    }
}